

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles3::Performance::InvalidShaderCompilerTextureCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerTextureCase *this,
          int measurementNdx)

{
  uint uVar1;
  InvalidityType IVar2;
  ConditionalType conditionalType;
  ConditionalType in_R8D;
  uint uVar3;
  ConditionalType validity;
  string local_70;
  string local_50;
  
  uVar1 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
  uVar3 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
  uVar1 = (this->super_InvalidShaderCompilerCase).m_startHash;
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  IVar2 = (this->super_InvalidShaderCompilerCase).m_invalidityType;
  conditionalType = IVar2 == INVALIDITY_SEMANTIC_ERROR ^ CONDITIONAL_TYPE_LAST;
  validity = CONDITIONAL_TYPE_UNIFORM;
  if (IVar2 != INVALIDITY_INVALID_CHAR) {
    validity = conditionalType;
  }
  textureLookupVertexTemplate_abi_cxx11_
            (&local_70,(Performance *)(ulong)this->m_conditionalUsage,this->m_conditionalType,
             conditionalType);
  uVar3 = uVar3 >> 0xf ^ uVar1 ^ uVar3;
  specializeShaderSource(&local_50,&local_70,uVar3,validity);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  textureLookupFragmentTemplate_abi_cxx11_
            (&local_70,(Performance *)(ulong)(uint)this->m_numLookups,this->m_conditionalUsage,
             this->m_conditionalType,in_R8D);
  specializeShaderSource(&local_50,&local_70,uVar3,validity);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerTextureCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	result.vertShaderSource = specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, shaderValidity);
	result.fragShaderSource = specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, shaderValidity);

	return result;
}